

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

sg_buffer sg_make_buffer(sg_buffer_desc *desc)

{
  sg_buffer buf_id;
  long lVar1;
  sg_buffer_desc *psVar2;
  sg_buffer_desc desc_def;
  sg_buffer_desc sStack_68;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3ae7,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  if (desc != (sg_buffer_desc *)0x0) {
    psVar2 = &sStack_68;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)psVar2 = *(undefined8 *)desc;
      desc = (sg_buffer_desc *)&desc->size;
      psVar2 = (sg_buffer_desc *)((long)psVar2 + 8);
    }
    sStack_68.type = sStack_68.type + (sStack_68.type == _SG_BUFFERTYPE_DEFAULT);
    sStack_68.usage = sStack_68.usage + (sStack_68.usage == _SG_USAGE_DEFAULT);
    if (sStack_68.size == 0) {
      sStack_68.size = sStack_68.data.size;
    }
    else if (sStack_68.data.size == 0) {
      sStack_68.data.size = sStack_68.size;
    }
    buf_id = _sg_alloc_buffer();
    if (buf_id.id == 0) {
      puts("buffer pool exhausted!");
    }
    else {
      _sg_init_buffer(buf_id,&sStack_68);
    }
    return (sg_buffer)buf_id.id;
  }
  __assert_fail("desc",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                ,0x3ae8,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
}

Assistant:

inline sg_buffer sg_make_buffer(const sg_buffer_desc& desc) { return sg_make_buffer(&desc); }